

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O0

DecodeStatus DecodeMemOperandSc(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint in_ESI;
  MCInst *in_RDI;
  uint offsetreg;
  uint basereg;
  uint8_t unit;
  uint8_t mode;
  uint8_t offset;
  uint8_t base;
  uint8_t scaled;
  byte local_2b;
  byte local_2a;
  
  bVar1 = (byte)(in_ESI >> 0xf) & 1;
  local_2a = (byte)(in_ESI >> 10) & 0x1f;
  local_2b = (byte)(in_ESI >> 5) & 0x1f;
  bVar2 = (byte)(in_ESI >> 1) & 0xf;
  bVar3 = (byte)in_ESI & 1;
  if ((local_2a < 0x19) || (0x38 < local_2a)) {
    if ((0x38 < local_2a) && (local_2a < 0x59)) {
      local_2a = local_2a - 0x20;
    }
  }
  else {
    local_2a = local_2a + 0x20;
  }
  uVar4 = getReg(GPRegsDecoderTable,(uint)local_2a);
  if (uVar4 == 0xffffffff) {
    return MCDisassembler_Fail;
  }
  uVar5 = (uint)bVar2;
  if (uVar5 < 2) {
LAB_003af239:
    MCOperand_CreateImm0
              (in_RDI,(ulong)((uint)bVar1 << 0x13 | uVar4 << 0xc | (uint)local_2b << 5 |
                              (uint)bVar2 << 1 | (uint)bVar3));
  }
  else {
    if (1 < uVar5 - 4) {
      if (uVar5 - 8 < 4) goto LAB_003af239;
      if (3 < uVar5 - 0xc) {
        return MCDisassembler_Fail;
      }
    }
    if ((local_2b < 0x19) || (0x38 < local_2b)) {
      if ((0x38 < local_2b) && (local_2b < 0x59)) {
        local_2b = local_2b - 0x20;
      }
    }
    else {
      local_2b = local_2b + 0x20;
    }
    uVar5 = getReg(GPRegsDecoderTable,(uint)local_2b);
    if (uVar5 == 0xffffffff) {
      return MCDisassembler_Fail;
    }
    MCOperand_CreateImm0
              (in_RDI,(ulong)((uint)bVar1 << 0x13 | uVar4 << 0xc | uVar5 << 5 | (uint)bVar2 << 1 |
                             (uint)bVar3));
  }
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMemOperandSc(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	uint8_t scaled, base, offset, mode, unit;
	unsigned basereg, offsetreg;

	scaled = (Val >> 15) & 1;
	base = (Val >> 10) & 0x1f;
	offset = (Val >> 5) & 0x1f;
	mode = (Val >> 1) & 0xf;
	unit = Val & 1;

	if((base >= TMS320C64X_REG_A0) && (base <= TMS320C64X_REG_A31))
		base = (base - TMS320C64X_REG_A0 + TMS320C64X_REG_B0);
	else if((base >= TMS320C64X_REG_B0) && (base <= TMS320C64X_REG_B31))
		base = (base - TMS320C64X_REG_B0 + TMS320C64X_REG_A0);
	basereg = getReg(GPRegsDecoderTable, base);
	if (basereg ==  ~0U)
		return MCDisassembler_Fail;

	switch(mode) {
		case 0:
		case 1:
		case 8:
		case 9:
		case 10:
		case 11:
			MCOperand_CreateImm0(Inst, (scaled << 19) | (basereg << 12) | (offset << 5) | (mode << 1) | unit);
			break;
		case 4:
		case 5:
		case 12:
		case 13:
		case 14:
		case 15:
			if((offset >= TMS320C64X_REG_A0) && (offset <= TMS320C64X_REG_A31))
				offset = (offset - TMS320C64X_REG_A0 + TMS320C64X_REG_B0);
			else if((offset >= TMS320C64X_REG_B0) && (offset <= TMS320C64X_REG_B31))
				offset = (offset - TMS320C64X_REG_B0 + TMS320C64X_REG_A0);
			offsetreg = getReg(GPRegsDecoderTable, offset);
			if (offsetreg ==  ~0U)
				return MCDisassembler_Fail;
			MCOperand_CreateImm0(Inst, (scaled << 19) | (basereg << 12) | (offsetreg << 5) | (mode << 1) | unit);
			break;
		default:
			return MCDisassembler_Fail;
	}

	return MCDisassembler_Success;
}